

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.cpp
# Opt level: O2

string * __thiscall
XPMP2::GetMiscNetwTimeStr_abi_cxx11_(string *__return_storage_ptr__,XPMP2 *this,float _time)

{
  float fVar1;
  allocator<char> local_29;
  char aszTimeStr [20];
  
  if (NAN(_time)) {
    _time = GetMiscNetwTime();
  }
  fVar1 = _time - (float)((long)(_time / 3600.0) & 0xffffffff) * 3600.0;
  snprintf(aszTimeStr,0x14,"%u:%02u:%06.3f",
           (double)(fVar1 - (float)((long)(fVar1 / 60.0) & 0xffffffff) * 60.0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,aszTimeStr,&local_29);
  return __return_storage_ptr__;
}

Assistant:

std::string GetMiscNetwTimeStr (float _time)
{
    char aszTimeStr[20];
    if (std::isnan(_time))
        _time = GetMiscNetwTime();
    
    const unsigned runH = unsigned(_time / 3600.0f);
    _time -= runH * 3600.0f;
    const unsigned runM = unsigned(_time / 60.0f);
    _time -= runM * 60.0f;
    
    snprintf(aszTimeStr, sizeof(aszTimeStr), "%u:%02u:%06.3f",
             runH, runM, _time);
    return aszTimeStr;
}